

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

void anon_unknown.dwarf_57ca7::createPositiveYEdge<double>
               (vector<double,_std::allocator<double>_> *data,
               vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *point,double x,
               double y)

{
  bool bVar1;
  reference pdVar2;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *in_XMM0_Qa;
  value_type *in_XMM1_Qa;
  const_iterator dataY;
  value_type *in_stack_ffffffffffffffa8;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *in_stack_ffffffffffffffb0;
  PointBase2D<double> local_40;
  double *local_30;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  value_type *local_20;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *local_18;
  
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  local_28._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::cbegin
                 ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa8);
  while( true ) {
    local_30 = (double *)
               std::vector<double,_std::allocator<double>_>::cend
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffa8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    in_stack_ffffffffffffffa8 = local_20;
    in_stack_ffffffffffffffb0 = local_18;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_28);
    PointBase2D<double>::PointBase2D
              (&local_40,(double)in_stack_ffffffffffffffb0,
               (double)in_stack_ffffffffffffffa8 + *pdVar2);
    std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::push_back
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_28);
  }
  return;
}

Assistant:

void createPositiveYEdge( const std::vector< _Type > & data, std::vector < PointBase2D<_Type> > & point, _Type x, _Type y )
    {
        for ( typename std::vector < _Type >::const_iterator dataY = data.cbegin(); dataY != data.cend(); ++dataY )
            point.push_back( PointBase2D<_Type>( x, y + (*dataY) ) );
    }